

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_lzcomp_internal.cpp
# Opt level: O0

bool __thiscall lzham::lzcompressor::compress_block(lzcompressor *this,void *pBuf,uint buf_len)

{
  lzdecision lzdec;
  bool bVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  atomic32_t aVar5;
  vector<lzham::lzcompressor::lzdecision> *this_00;
  lzdecision *plVar6;
  vector<unsigned_char> *pvVar7;
  uint in_EDX;
  void *in_RSI;
  long in_RDI;
  scoped_perf_section append_timer;
  uint i_1;
  uint8 *pSrc;
  uint compressed_size;
  scoped_perf_section stop_encoding_timer;
  scoped_perf_section add_bytes_timer;
  int dec_step;
  int end_dec_index;
  int i;
  vector<lzham::lzcompressor::lzdecision> *best_decisions;
  parse_thread_state *parse_thread_1;
  uint parse_thread_index_2;
  scoped_perf_section coding_timer;
  uint parse_thread_index_1;
  scoped_perf_section wait_timer;
  scoped_perf_section queue_task_timer;
  scoped_perf_section parse_timer;
  parse_thread_state *parse_thread;
  uint parse_thread_index;
  uint parse_thread_remaining;
  uint parse_thread_total_size;
  uint parse_thread_start_ofs;
  bool force_small_block;
  uint num_parse_jobs;
  uint initial_step;
  coding_stats initial_stats;
  uint bytes_to_match;
  uint cur_dict_ofs;
  scoped_perf_section compress_block_timer;
  lzcompressor *in_stack_ffffffffffffdff8;
  search_accelerator *in_stack_ffffffffffffe000;
  search_accelerator *in_stack_ffffffffffffe008;
  undefined4 in_stack_ffffffffffffe010;
  int in_stack_ffffffffffffe014;
  uint in_stack_ffffffffffffe018;
  uint in_stack_ffffffffffffe01c;
  uint in_stack_ffffffffffffe020;
  undefined4 in_stack_ffffffffffffe024;
  int iVar8;
  uint num_tasks;
  undefined4 in_stack_ffffffffffffe038;
  undefined4 in_stack_ffffffffffffe03c;
  uint uVar9;
  offset_in_lzcompressor_to_subr in_stack_ffffffffffffe040;
  undefined4 in_stack_ffffffffffffe048;
  undefined4 in_stack_ffffffffffffe04c;
  lzcompressor *in_stack_ffffffffffffe050;
  int in_stack_ffffffffffffe058;
  undefined4 in_stack_ffffffffffffe05c;
  int local_1f94;
  uint local_1f90;
  uint local_1f8c;
  void *in_stack_ffffffffffffe080;
  uint local_1f78;
  scoped_perf_section local_1f71;
  uint local_1f70;
  scoped_perf_section local_1f69;
  code *local_1f68;
  undefined8 local_1f60;
  scoped_perf_section local_1f52;
  scoped_perf_section local_1f51;
  int *local_1f50;
  uint local_1f44;
  uint local_1f40;
  uint local_1f3c;
  int local_1f38;
  char local_1f31;
  uint local_1f30;
  undefined4 local_1f2c;
  undefined1 local_1f28 [7936];
  uint local_28;
  int local_24;
  scoped_perf_section local_1d;
  uint local_1c;
  void *local_18;
  bool local_1;
  
  iVar8 = (int)in_RDI;
  num_tasks = (uint)((ulong)in_RDI >> 0x20);
  local_1c = in_EDX;
  local_18 = in_RSI;
  scoped_perf_section::scoped_perf_section
            (&local_1d,cVarArgs,"****** compress_block %u",(ulong)*(uint *)(in_RDI + 0x3878));
  if (*(long *)(CONCAT44(num_tasks,iVar8) + 0x17c8) < 0) {
    local_1 = false;
  }
  else {
    *(ulong *)(CONCAT44(num_tasks,iVar8) + 0x17c8) =
         (ulong)local_1c + *(long *)(CONCAT44(num_tasks,iVar8) + 0x17c8);
    bVar1 = search_accelerator::add_bytes_begin
                      ((search_accelerator *)
                       CONCAT44(in_stack_ffffffffffffe024,in_stack_ffffffffffffe020),
                       in_stack_ffffffffffffe01c,
                       (uint8 *)CONCAT44(in_stack_ffffffffffffe014,in_stack_ffffffffffffe010));
    if (bVar1) {
      uVar2 = adler32(local_18,(ulong)local_1c,*(uint *)(CONCAT44(num_tasks,iVar8) + 0x17d0));
      *(uint *)(CONCAT44(num_tasks,iVar8) + 0x17d0) = uVar2;
      uVar2 = search_accelerator::get_lookahead_pos
                        ((search_accelerator *)(CONCAT44(num_tasks,iVar8) + 0x17d8));
      uVar3 = search_accelerator::get_max_dict_size
                        ((search_accelerator *)(CONCAT44(num_tasks,iVar8) + 0x17d8));
      *(uint *)(CONCAT44(num_tasks,iVar8) + 0x3874) = uVar2 & uVar3 - 1;
      local_24 = *(int *)(CONCAT44(num_tasks,iVar8) + 0x3874);
      local_28 = local_1c;
      bVar1 = symbol_codec::start_encoding
                        ((symbol_codec *)in_stack_ffffffffffffe008,
                         (uint)((ulong)in_stack_ffffffffffffe000 >> 0x20));
      if (bVar1) {
        if ((*(int *)(CONCAT44(num_tasks,iVar8) + 0x3878) != 0) ||
           (bVar1 = send_configuration(in_stack_ffffffffffffdff8), bVar1)) {
          bVar1 = symbol_codec::encode_bits
                            ((symbol_codec *)in_stack_ffffffffffffe008,
                             (uint)((ulong)in_stack_ffffffffffffe000 >> 0x20),
                             (uint)in_stack_ffffffffffffe000);
          if (bVar1) {
            bVar1 = symbol_codec::encode_arith_init((symbol_codec *)in_stack_ffffffffffffdff8);
            if (bVar1) {
              state::start_of_block
                        ((state *)CONCAT44(in_stack_ffffffffffffe014,in_stack_ffffffffffffe010),
                         in_stack_ffffffffffffe008,(uint)((ulong)in_stack_ffffffffffffe000 >> 0x20),
                         (uint)in_stack_ffffffffffffe000);
              state::operator=((state *)in_stack_ffffffffffffe050,
                               (state *)CONCAT44(in_stack_ffffffffffffe04c,in_stack_ffffffffffffe048
                                                ));
              memcpy(local_1f28,(void *)(CONCAT44(num_tasks,iVar8) + 0x1950),0x1f00);
              local_1f2c = *(undefined4 *)(CONCAT44(num_tasks,iVar8) + 0x3870);
              while (local_28 != 0) {
                uVar9 = *(uint *)(CONCAT44(num_tasks,iVar8) + 0xcbb0);
                if (uVar9 < (local_28 + 0xbff) / 0xc00) {
                  uVar4 = *(uint *)(CONCAT44(num_tasks,iVar8) + 0xcbb0);
                }
                else {
                  uVar4 = (local_28 + 0xbff) / 0xc00;
                }
                local_1f30 = uVar4;
                if ((((*(uint *)(CONCAT44(num_tasks,iVar8) + 0x17b0) & 4) == 0) &&
                    ((*(byte *)(CONCAT44(num_tasks,iVar8) + 0x387d) & 1) != 0)) &&
                   (uVar3 = search_accelerator::get_max_helper_threads
                                      ((search_accelerator *)(CONCAT44(num_tasks,iVar8) + 0x17d8)),
                   uVar3 != 0)) {
                  aVar5 = search_accelerator::get_num_completed_helper_threads
                                    ((search_accelerator *)(CONCAT44(num_tasks,iVar8) + 0x17d8));
                  in_stack_ffffffffffffe020 = local_1f30 + (int)aVar5;
                  local_1f30 = in_stack_ffffffffffffe020;
                  if (7 < in_stack_ffffffffffffe020) {
                    in_stack_ffffffffffffe020 = 8;
                    local_1f30 = in_stack_ffffffffffffe020;
                  }
                }
                if (local_28 < 0x600) {
                  local_1f30 = 1;
                }
                local_1f31 = '\0';
                if ((*(int *)(CONCAT44(num_tasks,iVar8) + 0x3878) == 0) &&
                   ((uint)(local_24 - *(int *)(CONCAT44(num_tasks,iVar8) + 0x3874)) < 0xc00)) {
                  local_1f30 = 1;
                  local_1f31 = '\x01';
                }
                local_1f38 = local_24;
                in_stack_ffffffffffffe01c = local_28;
                if (local_1f30 * 0xc00 <= local_28) {
                  in_stack_ffffffffffffe01c = local_1f30 * 0xc00;
                }
                local_1f3c = in_stack_ffffffffffffe01c;
                if ((local_1f31 != '\0') &&
                   (in_stack_ffffffffffffe018 = in_stack_ffffffffffffe01c,
                   0x5ff < in_stack_ffffffffffffe01c)) {
                  local_1f3c = 0x600;
                  in_stack_ffffffffffffe018 = local_1f3c;
                }
                local_1f40 = local_1f3c;
                for (local_1f44 = 0; local_1f44 < local_1f30; local_1f44 = local_1f44 + 1) {
                  local_1f50 = (int *)(CONCAT44(num_tasks,iVar8) + 0xcbb8 +
                                      (ulong)local_1f44 * 0xb2b00);
                  state::operator=((state *)in_stack_ffffffffffffe050,
                                   (state *)CONCAT44(in_stack_ffffffffffffe04c,
                                                     in_stack_ffffffffffffe048));
                  local_1f50[2] = local_1f38;
                  if (local_1f44 == 0) {
                    *(undefined1 *)((long)local_1f50 + 0xb2a99) = 0;
                  }
                  else {
                    state::reset_state_partial((state *)(local_1f50 + 2));
                    *(undefined1 *)((long)local_1f50 + 0xb2a99) = 1;
                  }
                  *local_1f50 = local_1f38;
                  if (local_1f44 == local_1f30 - 1) {
                    local_1f50[1] = local_1f40;
                  }
                  else {
                    local_1f50[1] = local_1f3c / local_1f30;
                  }
                  if ((uint)local_1f50[1] < 0xc00) {
                    in_stack_ffffffffffffe014 = local_1f50[1];
                  }
                  else {
                    in_stack_ffffffffffffe014 = 0xc00;
                  }
                  local_1f50[1] = in_stack_ffffffffffffe014;
                  local_1f38 = local_1f50[1] + local_1f38;
                  local_1f40 = local_1f40 - local_1f50[1];
                }
                scoped_perf_section::scoped_perf_section(&local_1f51,"parsing");
                if (((*(byte *)(CONCAT44(num_tasks,iVar8) + 0x387d) & 1) == 0) || (local_1f30 < 2))
                {
                  *(undefined8 *)(CONCAT44(num_tasks,iVar8) + 0x5a23b8) = 0x7fffffff;
                  for (local_1f70 = 0; local_1f70 < local_1f30; local_1f70 = local_1f70 + 1) {
                    parse_job_callback((lzcompressor *)CONCAT44(uVar4,in_stack_ffffffffffffe020),
                                       CONCAT44(in_stack_ffffffffffffe01c,in_stack_ffffffffffffe018)
                                       ,(void *)CONCAT44(in_stack_ffffffffffffe014,
                                                         in_stack_ffffffffffffe010));
                  }
                }
                else {
                  *(ulong *)(CONCAT44(num_tasks,iVar8) + 0x5a23b8) = (ulong)local_1f30;
                  scoped_perf_section::scoped_perf_section(&local_1f52,"queing parse tasks");
                  local_1f68 = parse_job_callback;
                  local_1f60 = 0;
                  in_stack_ffffffffffffdff8 = (lzcompressor *)0x0;
                  bVar1 = task_pool::
                          queue_multiple_object_tasks<lzham::lzcompressor,void(lzham::lzcompressor::*)(unsigned_long_long,void*)>
                                    ((task_pool *)
                                     CONCAT44(in_stack_ffffffffffffe05c,in_stack_ffffffffffffe058),
                                     in_stack_ffffffffffffe050,in_stack_ffffffffffffe040,
                                     CONCAT44(in_stack_ffffffffffffe03c,in_stack_ffffffffffffe038),
                                     num_tasks,in_stack_ffffffffffffe080);
                  if (!bVar1) {
                    return false;
                  }
                  parse_job_callback((lzcompressor *)CONCAT44(uVar4,in_stack_ffffffffffffe020),
                                     CONCAT44(in_stack_ffffffffffffe01c,in_stack_ffffffffffffe018),
                                     (void *)CONCAT44(in_stack_ffffffffffffe014,
                                                      in_stack_ffffffffffffe010));
                  scoped_perf_section::scoped_perf_section(&local_1f69,"waiting for jobs");
                  semaphore::wait((semaphore *)(CONCAT44(num_tasks,iVar8) + 0x5a23c0),
                                  (void *)0xffffffff);
                }
                scoped_perf_section::scoped_perf_section(&local_1f71,"coding");
                for (local_1f78 = 0; local_1f78 < local_1f30; local_1f78 = local_1f78 + 1) {
                  in_stack_ffffffffffffe080 =
                       (void *)(CONCAT44(num_tasks,iVar8) + 0xcbb8 + (ulong)local_1f78 * 0xb2b00);
                  if ((*(byte *)((long)in_stack_ffffffffffffe080 + 0xb2a9a) & 1) != 0) {
                    return false;
                  }
                  this_00 = (vector<lzham::lzcompressor::lzdecision> *)
                            ((long)in_stack_ffffffffffffe080 + 0xb2a88);
                  if ((*(byte *)((long)in_stack_ffffffffffffe080 + 0xb2a99) & 1) != 0) {
                    bVar1 = state::encode_reset_state_partial
                                      ((state *)CONCAT44(in_stack_ffffffffffffe01c,
                                                         in_stack_ffffffffffffe018),
                                       (symbol_codec *)
                                       CONCAT44(in_stack_ffffffffffffe014,in_stack_ffffffffffffe010)
                                       ,in_stack_ffffffffffffe008);
                    if (!bVar1) {
                      return false;
                    }
                    *(int *)(CONCAT44(num_tasks,iVar8) + 0x3870) =
                         *(int *)(CONCAT44(num_tasks,iVar8) + 0x3870) + 1;
                  }
                  uVar3 = vector<lzham::lzcompressor::lzdecision>::size(this_00);
                  if (uVar3 != 0) {
                    local_1f8c = 0;
                    local_1f90 = vector<lzham::lzcompressor::lzdecision>::size(this_00);
                    local_1f90 = local_1f90 - 1;
                    local_1f94 = 1;
                    if ((*(byte *)((long)in_stack_ffffffffffffe080 + 0xb2a98) & 1) != 0) {
                      local_1f8c = vector<lzham::lzcompressor::lzdecision>::size(this_00);
                      local_1f8c = local_1f8c - 1;
                      local_1f90 = 0;
                      local_1f94 = -1;
                    }
                    while( true ) {
                      plVar6 = vector<lzham::lzcompressor::lzdecision>::operator[]
                                         (this_00,local_1f8c);
                      in_stack_ffffffffffffe050 = *(lzcompressor **)plVar6;
                      in_stack_ffffffffffffe058 = plVar6->m_dist;
                      lzdec.m_len = uVar2;
                      lzdec.m_pos = uVar9;
                      lzdec.m_dist = iVar8;
                      bVar1 = code_decision((lzcompressor *)
                                            CONCAT44(in_stack_ffffffffffffe014,
                                                     in_stack_ffffffffffffe010),lzdec,
                                            (uint *)in_stack_ffffffffffffe008,
                                            (uint *)in_stack_ffffffffffffe000);
                      if (!bVar1) {
                        return false;
                      }
                      if (local_1f8c == local_1f90) break;
                      local_1f8c = local_1f94 + local_1f8c;
                    }
                  }
                }
              }
              scoped_perf_section::scoped_perf_section
                        ((scoped_perf_section *)&stack0xffffffffffffe04f,"add_bytes_end");
              search_accelerator::add_bytes_end(in_stack_ffffffffffffe000);
              bVar1 = state::encode_eob((state *)CONCAT44(in_stack_ffffffffffffe01c,
                                                          in_stack_ffffffffffffe018),
                                        (symbol_codec *)
                                        CONCAT44(in_stack_ffffffffffffe014,in_stack_ffffffffffffe010
                                                ),in_stack_ffffffffffffe008);
              if (bVar1) {
                scoped_perf_section::scoped_perf_section
                          ((scoped_perf_section *)&stack0xffffffffffffe04e,"stop_encoding");
                bVar1 = symbol_codec::stop_encoding
                                  ((symbol_codec *)in_stack_ffffffffffffe008,
                                   SUB81((ulong)in_stack_ffffffffffffe000 >> 0x38,0));
                if (bVar1) {
                  pvVar7 = symbol_codec::get_encoding_buf
                                     ((symbol_codec *)(CONCAT44(num_tasks,iVar8) + 0x18a8));
                  uVar2 = vector<unsigned_char>::size(pvVar7);
                  if (local_1c <= uVar2) {
                    state::operator=((state *)in_stack_ffffffffffffe050,
                                     (state *)CONCAT44(in_stack_ffffffffffffe04c,uVar2));
                    *(undefined4 *)(CONCAT44(num_tasks,iVar8) + 0x3870) = local_1f2c;
                    symbol_codec::clear((symbol_codec *)in_stack_ffffffffffffe000);
                    bVar1 = symbol_codec::start_encoding
                                      ((symbol_codec *)in_stack_ffffffffffffe008,
                                       (uint)((ulong)in_stack_ffffffffffffe000 >> 0x20));
                    if (!bVar1) {
                      return false;
                    }
                    if ((*(int *)(CONCAT44(num_tasks,iVar8) + 0x3878) == 0) &&
                       (bVar1 = send_configuration(in_stack_ffffffffffffdff8), !bVar1)) {
                      return false;
                    }
                    bVar1 = symbol_codec::encode_bits
                                      ((symbol_codec *)in_stack_ffffffffffffe008,
                                       (uint)((ulong)in_stack_ffffffffffffe000 >> 0x20),
                                       (uint)in_stack_ffffffffffffe000);
                    if (!bVar1) {
                      return false;
                    }
                    bVar1 = symbol_codec::encode_bits
                                      ((symbol_codec *)in_stack_ffffffffffffe008,
                                       (uint)((ulong)in_stack_ffffffffffffe000 >> 0x20),
                                       (uint)in_stack_ffffffffffffe000);
                    if (!bVar1) {
                      return false;
                    }
                    bVar1 = symbol_codec::encode_align_to_byte
                                      ((symbol_codec *)in_stack_ffffffffffffdff8);
                    if (!bVar1) {
                      return false;
                    }
                    search_accelerator::get_ptr
                              (in_stack_ffffffffffffe000,
                               (uint)((ulong)in_stack_ffffffffffffdff8 >> 0x20));
                    for (uVar9 = 0; uVar9 < local_1c; uVar9 = uVar9 + 1) {
                      bVar1 = symbol_codec::encode_bits
                                        ((symbol_codec *)in_stack_ffffffffffffe008,
                                         (uint)((ulong)in_stack_ffffffffffffe000 >> 0x20),
                                         (uint)in_stack_ffffffffffffe000);
                      if (!bVar1) {
                        return false;
                      }
                    }
                    bVar1 = symbol_codec::stop_encoding
                                      ((symbol_codec *)in_stack_ffffffffffffe008,
                                       SUB81((ulong)in_stack_ffffffffffffe000 >> 0x38,0));
                    if (!bVar1) {
                      return false;
                    }
                  }
                  scoped_perf_section::scoped_perf_section
                            ((scoped_perf_section *)&stack0xffffffffffffe03b,"append");
                  bVar1 = vector<unsigned_char>::empty
                                    ((vector<unsigned_char> *)(CONCAT44(num_tasks,iVar8) + 0x3860));
                  if (bVar1) {
                    symbol_codec::get_encoding_buf
                              ((symbol_codec *)(CONCAT44(num_tasks,iVar8) + 0x18a8));
                    vector<unsigned_char>::swap
                              ((vector<unsigned_char> *)in_stack_ffffffffffffe000,
                               (vector<unsigned_char> *)in_stack_ffffffffffffdff8);
                  }
                  else {
                    pvVar7 = (vector<unsigned_char> *)(CONCAT44(num_tasks,iVar8) + 0x3860);
                    symbol_codec::get_encoding_buf
                              ((symbol_codec *)(CONCAT44(num_tasks,iVar8) + 0x18a8));
                    bVar1 = vector<unsigned_char>::append
                                      ((vector<unsigned_char> *)in_stack_ffffffffffffe008,pvVar7);
                    if (!bVar1) {
                      return false;
                    }
                  }
                  *(int *)(CONCAT44(num_tasks,iVar8) + 0x3878) =
                       *(int *)(CONCAT44(num_tasks,iVar8) + 0x3878) + 1;
                  local_1 = true;
                }
                else {
                  local_1 = false;
                }
              }
              else {
                local_1 = false;
              }
            }
            else {
              local_1 = false;
            }
          }
          else {
            local_1 = false;
          }
        }
        else {
          local_1 = false;
        }
      }
      else {
        local_1 = false;
      }
    }
    else {
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

bool lzcompressor::compress_block(const void* pBuf, uint buf_len)
   {
      scoped_perf_section compress_block_timer(cVarArgs, "****** compress_block %u", m_block_index);

      LZHAM_ASSERT(pBuf);
      LZHAM_ASSERT(buf_len <= m_params.m_block_size);

      LZHAM_ASSERT(m_src_size >= 0);
      if (m_src_size < 0)
         return false;

      m_src_size += buf_len;

      if (!m_accel.add_bytes_begin(buf_len, static_cast<const uint8*>(pBuf)))
         return false;

      m_src_adler32 = adler32(pBuf, buf_len, m_src_adler32);

      m_block_start_dict_ofs = m_accel.get_lookahead_pos() & (m_accel.get_max_dict_size() - 1);

      uint cur_dict_ofs = m_block_start_dict_ofs;

      uint bytes_to_match = buf_len;

      if (!m_codec.start_encoding((buf_len * 9) / 8))
         return false;

      if (!m_block_index)
      {
         if (!send_configuration())
            return false;
      }

#ifdef LZHAM_LZDEBUG
      m_codec.encode_bits(166, 12);
#endif

      if (!m_codec.encode_bits(cCompBlock, cBlockHeaderBits))
         return false;

      if (!m_codec.encode_arith_init())
         return false;

      m_state.start_of_block(m_accel, cur_dict_ofs, m_block_index);

      m_initial_state = m_state;

      coding_stats initial_stats(m_stats);

      uint initial_step = m_step;

#if 0
#ifdef LZHAM_LZVERIFY
      // TODO: This no longer works.
      lzham::vector<lzdecision> lzdecisions0;
      if (!lzdecisions0.try_reserve(64))
         return false;

      for (uint i = 0; i < bytes_to_match; i++)
      {
         uint cur_dict_ofs = m_block_start_dict_ofs + i;
         int largest_match_index = enumerate_lz_decisions(cur_dict_ofs, m_state, lzdecisions0, 1);
         if (largest_match_index < 0)
            return false;

         bit_cost_t largest_match_cost = lzdecisions0[largest_match_index].m_cost;
         uint largest_match_len = lzdecisions0[largest_match_index].get_len();

         for (uint j = 0; j < lzdecisions0.size(); j++)
         {
            const lzdecision& lzdec = lzdecisions0[j];

            if (lzdec.is_match())
            {
               uint match_dist = lzdec.get_match_dist(m_state);

               for (uint k = 0; k < lzdec.get_len(); k++)
               {
                  LZHAM_VERIFY(m_accel[cur_dict_ofs+k] == m_accel[(cur_dict_ofs+k - match_dist) & (m_accel.get_max_dict_size() - 1)]);
               }
            }
         }
      }
#endif
#endif

      while (bytes_to_match)
      {
         uint num_parse_jobs = LZHAM_MIN(m_num_parse_threads, (bytes_to_match + cMaxParseGraphNodes - 1) / cMaxParseGraphNodes);
         if ((m_params.m_lzham_compress_flags & LZHAM_COMP_FLAG_DETERMINISTIC_PARSING) == 0)
         {
            if (m_use_task_pool && m_accel.get_max_helper_threads())
            {
               // Increase the number of parser threads as the match finder finishes up.
               num_parse_jobs += m_accel.get_num_completed_helper_threads();
               num_parse_jobs = LZHAM_MIN(num_parse_jobs, cMaxParseThreads);
            }
         }
         if (bytes_to_match < 1536)
            num_parse_jobs = 1;

         // Reduce block size near the beginning of the file so statistical models get going a bit faster.
         bool force_small_block = false;
         if ( (!m_block_index) && ((cur_dict_ofs - m_block_start_dict_ofs) < cMaxParseGraphNodes) )
         {
            num_parse_jobs = 1;
            force_small_block = true;
         }

         uint parse_thread_start_ofs = cur_dict_ofs;
         uint parse_thread_total_size = LZHAM_MIN(bytes_to_match, cMaxParseGraphNodes * num_parse_jobs);
         if (force_small_block)
         {
            parse_thread_total_size = LZHAM_MIN(parse_thread_total_size, 1536);
         }

         uint parse_thread_remaining = parse_thread_total_size;
         for (uint parse_thread_index = 0; parse_thread_index < num_parse_jobs; parse_thread_index++)
         {
            parse_thread_state &parse_thread = m_parse_thread_state[parse_thread_index];

            parse_thread.m_approx_state = m_state;
            parse_thread.m_approx_state.m_cur_ofs = parse_thread_start_ofs;

            if (parse_thread_index > 0)
            {
               parse_thread.m_approx_state.reset_state_partial();
               parse_thread.m_issued_reset_state_partial = true;
            }
            else
            {
               parse_thread.m_issued_reset_state_partial = false;
            }

            parse_thread.m_start_ofs = parse_thread_start_ofs;
            if (parse_thread_index == (num_parse_jobs - 1))
               parse_thread.m_bytes_to_match = parse_thread_remaining;
            else
               parse_thread.m_bytes_to_match = parse_thread_total_size / num_parse_jobs;

            parse_thread.m_bytes_to_match = LZHAM_MIN(parse_thread.m_bytes_to_match, cMaxParseGraphNodes);
            LZHAM_ASSERT(parse_thread.m_bytes_to_match > 0);

            parse_thread_start_ofs += parse_thread.m_bytes_to_match;
            parse_thread_remaining -= parse_thread.m_bytes_to_match;
         }

         {
            scoped_perf_section parse_timer("parsing");

            if ((m_use_task_pool) && (num_parse_jobs > 1))
            {
               m_parse_jobs_remaining = num_parse_jobs;

               {
                  scoped_perf_section queue_task_timer("queing parse tasks");

                  if (!m_params.m_pTask_pool->queue_multiple_object_tasks(this, &lzcompressor::parse_job_callback, 1, num_parse_jobs - 1))
                     return false;
               }

               parse_job_callback(0, NULL);

               {
                  scoped_perf_section wait_timer("waiting for jobs");

                  m_parse_jobs_complete.wait();
               }
            }
            else
            {
               m_parse_jobs_remaining = INT_MAX;
               for (uint parse_thread_index = 0; parse_thread_index < num_parse_jobs; parse_thread_index++)
               {
                  parse_job_callback(parse_thread_index, NULL);
               }
            }
         }

         {
            scoped_perf_section coding_timer("coding");

            for (uint parse_thread_index = 0; parse_thread_index < num_parse_jobs; parse_thread_index++)
            {
               parse_thread_state &parse_thread = m_parse_thread_state[parse_thread_index];
               if (parse_thread.m_failed)
                  return false;

               const lzham::vector<lzdecision> &best_decisions = parse_thread.m_best_decisions;

               if (parse_thread.m_issued_reset_state_partial)
               {
                  if (!m_state.encode_reset_state_partial(m_codec, m_accel))
                     return false;
                  m_step++;
               }

               if (best_decisions.size())
               {
                  int i = 0;
                  int end_dec_index = static_cast<int>(best_decisions.size()) - 1;
                  int dec_step = 1;
                  if (parse_thread.m_emit_decisions_backwards)
                  {

                     i = static_cast<int>(best_decisions.size()) - 1;
                     end_dec_index = 0;

                     dec_step = -1;
                  }

                  LZHAM_ASSERT(best_decisions.back().m_pos == (int)parse_thread.m_start_ofs);

                  // Loop rearranged to avoid bad x64 codegen problem with MSVC2008.
                  for ( ; ; )
                  {
                     LZHAM_ASSERT(best_decisions[i].m_pos == (int)cur_dict_ofs);
                     LZHAM_ASSERT(i >= 0);
                     LZHAM_ASSERT(i < (int)best_decisions.size());

#if LZHAM_UPDATE_STATS
                     bit_cost_t cost = m_state.get_cost(*this, m_accel, best_decisions[i]);
                     m_stats.update(best_decisions[i], m_state, m_accel, cost);
#endif

                     if (!code_decision(best_decisions[i], cur_dict_ofs, bytes_to_match))
                        return false;
                     if (i == end_dec_index)
                        break;
                     i += dec_step;
                  }
               }

               LZHAM_ASSERT(cur_dict_ofs == parse_thread.m_start_ofs + parse_thread.m_bytes_to_match);

            } // parse_thread_index

         }
      }

      {
         scoped_perf_section add_bytes_timer("add_bytes_end");
         m_accel.add_bytes_end();
      }

      if (!m_state.encode_eob(m_codec, m_accel))
         return false;

#ifdef LZHAM_LZDEBUG
      if (!m_codec.encode_bits(366, 12)) return false;
#endif

      {
         scoped_perf_section stop_encoding_timer("stop_encoding");
         if (!m_codec.stop_encoding(true)) return false;
      }

      uint compressed_size = m_codec.get_encoding_buf().size();
      compressed_size;

#if defined(LZHAM_DISABLE_RAW_BLOCKS) || defined(LZHAM_LZDEBUG)
      if (0)
#else
      if (compressed_size >= buf_len)
#endif
      {
         m_state = m_initial_state;
         m_step = initial_step;
         //m_stats = initial_stats;

         m_codec.clear();

         if (!m_codec.start_encoding(buf_len + 16)) return false;

         if (!m_block_index)
         {
            if (!send_configuration())
               return false;
         }

#ifdef LZHAM_LZDEBUG
         if (!m_codec.encode_bits(166, 12)) return false;
#endif

         if (!m_codec.encode_bits(cRawBlock, cBlockHeaderBits)) return false;

         LZHAM_ASSERT(buf_len <= 0x1000000);
         if (!m_codec.encode_bits(buf_len - 1, 24)) return false;
         if (!m_codec.encode_align_to_byte()) return false;

         const uint8* pSrc = m_accel.get_ptr(m_block_start_dict_ofs);

         for (uint i = 0; i < buf_len; i++)
         {
            if (!m_codec.encode_bits(*pSrc++, 8)) return false;
         }

         if (!m_codec.stop_encoding(true)) return false;
      }

      {
         scoped_perf_section append_timer("append");

         if (m_comp_buf.empty())
         {
            m_comp_buf.swap(m_codec.get_encoding_buf());
         }
         else
         {
            if (!m_comp_buf.append(m_codec.get_encoding_buf()))
               return false;
         }
      }
#if LZHAM_UPDATE_STATS
      LZHAM_VERIFY(m_stats.m_total_bytes == m_src_size);
#endif

      m_block_index++;

      return true;
   }